

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tftpd.c
# Opt level: O0

void sendtftp(testcase *test,formats *pf)

{
  uint16_t uVar1;
  int *piVar2;
  ssize_t sVar3;
  tftphdr *sap;
  tftphdr *sdp;
  ssize_t sStack_28;
  unsigned_short sendblock;
  ssize_t n;
  formats *pfStack_18;
  int size;
  formats *pf_local;
  testcase *test_local;
  
  pfStack_18 = pf;
  pf_local = (formats *)test;
  sap = r_init();
  sdp._6_2_ = 1;
  mysignal(0xe,timer);
LAB_0010852b:
  n._4_4_ = readit((testcase *)pf_local,&sap,pfStack_18->f_convert);
  if ((int)n._4_4_ < 0) {
    piVar2 = __errno_location();
    nak(*piVar2 + 100);
  }
  else {
    uVar1 = htons(3);
    sap->th_opcode = uVar1;
    uVar1 = htons(sdp._6_2_);
    (sap->th_u1).th_u2.th_u3.tu_block = uVar1;
    timeout = 0;
    __sigsetjmp(timeoutbuf,1);
    if (*(int *)&pf_local[2].field_0xc != 0) {
      logmsg("Pausing %d seconds before %d bytes",(ulong)*(uint *)&pf_local[2].field_0xc,
             (ulong)n._4_4_);
      wait_ms(*(int *)&pf_local[2].field_0xc * 1000);
    }
    while (sVar3 = send(peer,sap,(long)(int)(n._4_4_ + 4),0x4000), sVar3 == (int)(n._4_4_ + 4)) {
      read_ahead((testcase *)pf_local,pfStack_18->f_convert);
      do {
        do {
          alarm(rexmtval);
          sStack_28 = recv(peer,&ackbuf,0x204,0);
          alarm(0);
          if (got_exit_signal != 0) {
            return;
          }
          if (sStack_28 < 0) {
            logmsg("read: fail");
            return;
          }
          ackbuf.hdr.th_opcode = ntohs(ackbuf.hdr.th_opcode);
          ackbuf._2_2_ = ntohs(ackbuf._2_2_);
          if (ackbuf.hdr.th_opcode == 5) {
            logmsg("got ERROR");
            return;
          }
        } while (ackbuf.hdr.th_opcode != 4);
        if (ackbuf._2_2_ == sdp._6_2_) {
          sdp._6_2_ = sdp._6_2_ + 1;
          if (n._4_4_ != 0x200) {
            return;
          }
          goto LAB_0010852b;
        }
        synchnet(peer);
      } while ((uint)(ushort)ackbuf._2_2_ != sdp._6_2_ - 1);
    }
    logmsg("write");
  }
  return;
}

Assistant:

static void sendtftp(struct testcase *test, struct formats *pf)
{
  int size;
  ssize_t n;
  /* These are volatile to live through a siglongjmp */
  volatile unsigned short sendblock; /* block count */
  struct tftphdr * volatile sdp = r_init(); /* data buffer */
  struct tftphdr * const sap = &ackbuf.hdr; /* ack buffer */

  sendblock = 1;
#if defined(HAVE_ALARM) && defined(SIGALRM)
  mysignal(SIGALRM, timer);
#endif
  do {
    size = readit(test, (struct tftphdr **)&sdp, pf->f_convert);
    if(size < 0) {
      nak(errno + 100);
      return;
    }
    sdp->th_opcode = htons((unsigned short)opcode_DATA);
    sdp->th_block = htons(sendblock);
    timeout = 0;
#ifdef HAVE_SIGSETJMP
    (void) sigsetjmp(timeoutbuf, 1);
#endif
    if(test->writedelay) {
      logmsg("Pausing %d seconds before %d bytes", test->writedelay,
             size);
      wait_ms(1000*test->writedelay);
    }

    send_data:
    if(swrite(peer, sdp, size + 4) != size + 4) {
      logmsg("write");
      return;
    }
    read_ahead(test, pf->f_convert);
    for(;;) {
#ifdef HAVE_ALARM
      alarm(rexmtval);        /* read the ack */
#endif
      n = sread(peer, &ackbuf.storage[0], sizeof(ackbuf.storage));
#ifdef HAVE_ALARM
      alarm(0);
#endif
      if(got_exit_signal)
        return;
      if(n < 0) {
        logmsg("read: fail");
        return;
      }
      sap->th_opcode = ntohs((unsigned short)sap->th_opcode);
      sap->th_block = ntohs(sap->th_block);

      if(sap->th_opcode == opcode_ERROR) {
        logmsg("got ERROR");
        return;
      }

      if(sap->th_opcode == opcode_ACK) {
        if(sap->th_block == sendblock) {
          break;
        }
        /* Re-synchronize with the other side */
        (void) synchnet(peer);
        if(sap->th_block == (sendblock-1)) {
          goto send_data;
        }
      }

    }
    sendblock++;
  } while(size == SEGSIZE);
}